

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

_GLFWmapping * findValidMapping(_GLFWjoystick *js)

{
  GLFWbool GVar1;
  _GLFWmapping *p_Var2;
  int local_24;
  int i;
  _GLFWmapping *mapping;
  _GLFWjoystick *js_local;
  
  p_Var2 = findMapping(js->guid);
  if (p_Var2 != (_GLFWmapping *)0x0) {
    for (local_24 = 0; local_24 < 0xf; local_24 = local_24 + 1) {
      GVar1 = isValidElementForJoystick(p_Var2->buttons + local_24,js);
      if (GVar1 == 0) {
        _glfwInputError(0x10004,"Invalid button in gamepad mapping %s (%s)",p_Var2->guid,p_Var2);
        return (_GLFWmapping *)0x0;
      }
    }
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      GVar1 = isValidElementForJoystick(p_Var2->axes + local_24,js);
      if (GVar1 == 0) {
        _glfwInputError(0x10004,"Invalid axis in gamepad mapping %s (%s)",p_Var2->guid,p_Var2);
        return (_GLFWmapping *)0x0;
      }
    }
  }
  return p_Var2;
}

Assistant:

static _GLFWmapping* findValidMapping(const _GLFWjoystick* js)
{
    _GLFWmapping* mapping = findMapping(js->guid);
    if (mapping)
    {
        int i;

        for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->buttons + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid button in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }

        for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->axes + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid axis in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }
    }

    return mapping;
}